

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

void resolve_gradient_stops
               (render_context_t *context,element_t *element,gradient_stop_array_t *stops)

{
  size_t sVar1;
  bool bVar2;
  plutovg_color_t pVar3;
  undefined8 local_48;
  undefined8 local_40;
  color_t local_38;
  color_t stop_color;
  float stop_opacity;
  float offset;
  element_t *child;
  gradient_stop_array_t *stops_local;
  element_t *element_local;
  render_context_t *context_local;
  
  _stop_opacity = element->first_child;
  while( true ) {
    bVar2 = false;
    if (_stop_opacity != (element_t *)0x0) {
      bVar2 = stops->size < 0x40;
    }
    if (!bVar2) break;
    if (_stop_opacity->id == 0xe) {
      stop_color.value = 0;
      stop_color.type = 0x3f800000;
      local_38.type = color_type_fixed;
      local_38.value = 0xff000000;
      parse_number(_stop_opacity,0x13,(float *)&stop_color.value,true,false);
      parse_number(_stop_opacity,0x1c,(float *)&stop_color,true,false);
      parse_color(_stop_opacity,0x1b,&local_38,false);
      stops->data[stops->size].offset = (float)stop_color.value;
      sVar1 = stops->size;
      pVar3 = resolve_color(context,_stop_opacity,&local_38);
      local_48 = pVar3._0_8_;
      stops->data[sVar1].color.r = (float)(undefined4)local_48;
      stops->data[sVar1].color.g = (float)local_48._4_4_;
      local_40 = pVar3._8_8_;
      stops->data[sVar1].color.b = (float)(undefined4)local_40;
      stops->data[sVar1].color.a = (float)local_40._4_4_;
      stops->data[stops->size].color.a = (float)stop_color.type * stops->data[stops->size].color.a;
      stops->size = stops->size + 1;
    }
    _stop_opacity = _stop_opacity->next_sibling;
  }
  return;
}

Assistant:

static void resolve_gradient_stops(const render_context_t* context, const element_t* element, gradient_stop_array_t* stops)
{
    const element_t* child = element->first_child;
    while(child && stops->size < MAX_STOPS) {
        if(child->id == TAG_STOP) {
            float offset = 0.f;
            float stop_opacity = 1.f;
            color_t stop_color = {color_type_fixed, 0xFF000000};

            parse_number(child, ATTR_OFFSET, &offset, true, false);
            parse_number(child, ATTR_STOP_OPACITY, &stop_opacity, true, false);
            parse_color(child, ATTR_STOP_COLOR, &stop_color, false);

            stops->data[stops->size].offset = offset;
            stops->data[stops->size].color = resolve_color(context, child, &stop_color);
            stops->data[stops->size].color.a *= stop_opacity;
            stops->size += 1;
        }

        child = child->next_sibling;
    }
}